

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Label __thiscall asmjit::BaseAssembler::newLabel(BaseAssembler *this)

{
  Error err;
  undefined4 uVar1;
  LabelEntry *in_RAX;
  uint32_t in_RDX [2];
  uint32_t extraout_RDX [2];
  uint32_t extraout_RDX_00 [2];
  BaseEmitter *in_RSI;
  Label LVar2;
  LabelEntry *le;
  
  if (in_RSI->_code != (CodeHolder *)0x0) {
    le = in_RAX;
    err = CodeHolder::newLabelEntry(in_RSI->_code,&le);
    if (err == 0) {
      uVar1 = *(undefined4 *)&le->field_0xc;
      in_RDX = extraout_RDX;
      goto LAB_0010abe8;
    }
    BaseEmitter::reportError(in_RSI,err,(char *)0x0);
    in_RDX = extraout_RDX_00;
  }
  uVar1 = 0xffffffff;
LAB_0010abe8:
  *(undefined4 *)&(this->super_BaseEmitter)._vptr_BaseEmitter = 4;
  *(undefined4 *)((long)&(this->super_BaseEmitter)._vptr_BaseEmitter + 4) = uVar1;
  (this->super_BaseEmitter)._emitterType = '\0';
  (this->super_BaseEmitter)._emitterFlags = '\0';
  (this->super_BaseEmitter)._validationFlags = '\0';
  (this->super_BaseEmitter)._validationOptions = '\0';
  (this->super_BaseEmitter)._encodingOptions = 0;
  LVar2.super_Operand.super_Operand_._data[0] = in_RDX[0];
  LVar2.super_Operand.super_Operand_._data[1] = in_RDX[1];
  LVar2.super_Operand.super_Operand_._0_8_ = this;
  return (Label)LVar2.super_Operand.super_Operand_;
}

Assistant:

Label BaseAssembler::newLabel() {
  uint32_t labelId = Globals::kInvalidId;
  if (ASMJIT_LIKELY(_code)) {
    LabelEntry* le;
    Error err = _code->newLabelEntry(&le);
    if (ASMJIT_UNLIKELY(err))
      reportError(err);
    else
      labelId = le->id();
  }
  return Label(labelId);
}